

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O3

char16_t * PAL_wcsncpy(char16_t *strDest,char16_t *strSource,size_t count)

{
  long lVar1;
  ulong uVar2;
  size_t sVar3;
  
  if (PAL_InitializeChakraCoreCalled) {
    memset(strDest,0,(ulong)(uint)((int)count * 2));
    if ((strSource == (char16_t *)0x0) || (*strSource == L'\0')) {
      count = 0;
    }
    else {
      uVar2 = 0;
      do {
        lVar1 = uVar2 + 1;
        uVar2 = uVar2 + 1;
      } while (strSource[lVar1] != L'\0');
      if (uVar2 <= count) {
        sVar3 = 0;
        do {
          count = sVar3 + 1;
          lVar1 = sVar3 + 1;
          sVar3 = count;
        } while (strSource[lVar1] != L'\0');
      }
    }
    memcpy(strDest,strSource,(ulong)(uint)((int)count * 2));
    if (PAL_InitializeChakraCoreCalled != false) {
      return strDest;
    }
  }
  abort();
}

Assistant:

char16_t *
__cdecl
PAL_wcsncpy( char16_t * strDest, const char16_t *strSource, size_t count )
{
    UINT length = sizeof( char16_t ) * count;
    PERF_ENTRY(wcsncpy);
    ENTRY("wcsncpy( strDest:%p, strSource:%p (%S), count:%lu)\n",
          strDest, strSource, strSource, (unsigned long) count);

    memset( strDest, 0, length );
    length = min( count, PAL_wcslen( strSource ) ) * sizeof( char16_t );
    memcpy( strDest, strSource, length );

    LOGEXIT("wcsncpy returning (char16_t*): %p\n", strDest);
    PERF_EXIT(wcsncpy);
    return strDest;
}